

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int evthread_make_base_notifiable(event_base *base)

{
  int r;
  event_base *base_local;
  
  if (base == (event_base *)0x0) {
    base_local._4_4_ = -1;
  }
  else {
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,base->th_base_lock);
    }
    base_local._4_4_ = evthread_make_base_notifiable_nolock_(base);
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
    }
  }
  return base_local._4_4_;
}

Assistant:

int
evthread_make_base_notifiable(struct event_base *base)
{
	int r;
	if (!base)
		return -1;

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	r = evthread_make_base_notifiable_nolock_(base);
	EVBASE_RELEASE_LOCK(base, th_base_lock);
	return r;
}